

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_read_write_null_arguments(void)

{
  int iVar1;
  uv_buf_t uVar2;
  int r;
  
  iVar1 = uv_fs_read(0,&read_req,0,0,0,0xffffffffffffffff,0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xde2,"r == UV_EINVAL");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_write(0,&write_req,0,0,0,0xffffffffffffffff,0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xde8,"r == UV_EINVAL");
    abort();
  }
  if (write_req.path != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xde9,"write_req.path == NULL");
    abort();
  }
  if (write_req.ptr != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdea,"write_req.ptr == NULL");
    abort();
  }
  if (write_req.new_path != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdf0,"write_req.new_path == NULL");
    abort();
  }
  if (write_req.bufs != (uv_buf_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdf1,"write_req.bufs == NULL");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  iov = (uv_buf_t)uv_buf_init(0,0);
  iVar1 = uv_fs_read(0,&read_req,0,&iov,0,0xffffffffffffffff,0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdf7,"r == UV_EINVAL");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  uVar2 = (uv_buf_t)uv_buf_init(0,0);
  iov = uVar2;
  iVar1 = uv_fs_write(0,&write_req,0,&iov,0,0xffffffffffffffff,0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xdfc,"r == UV_EINVAL");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_read(loop,&read_req,0,0,0,0xffffffffffffffff,fail_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe03,"r == UV_EINVAL");
    abort();
  }
  uv_run(loop,0);
  uv_fs_req_cleanup(&read_req);
  iVar1 = uv_fs_write(loop,&write_req,0,0,0,0xffffffffffffffff,fail_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe08,"r == UV_EINVAL");
    abort();
  }
  uv_run(loop,0);
  uv_fs_req_cleanup(&write_req);
  uVar2 = (uv_buf_t)uv_buf_init(0,0);
  iov = uVar2;
  iVar1 = uv_fs_read(loop,&read_req,0,&iov,0,0xffffffffffffffff,fail_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe0e,"r == UV_EINVAL");
    abort();
  }
  uv_run(loop,0);
  uv_fs_req_cleanup(&read_req);
  uVar2 = (uv_buf_t)uv_buf_init(0,0);
  iov = uVar2;
  iVar1 = uv_fs_write(loop,&write_req,0,&iov,0,0xffffffffffffffff,fail_cb);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xe14,"r == UV_EINVAL");
    abort();
  }
  uv_run(loop,0);
  uv_fs_req_cleanup(&write_req);
  return 0;
}

Assistant:

TEST_IMPL(fs_read_write_null_arguments) {
  int r;

  r = uv_fs_read(NULL, &read_req, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(NULL, &write_req, 0, NULL, 0, -1, NULL);
  /* Validate some memory management on failed input validation before sending
     fs work to the thread pool. */
  ASSERT(r == UV_EINVAL);
  ASSERT(write_req.path == NULL);
  ASSERT(write_req.ptr == NULL);
#ifdef _WIN32
  ASSERT(write_req.file.pathw == NULL);
  ASSERT(write_req.fs.info.new_pathw == NULL);
  ASSERT(write_req.fs.info.bufs == NULL);
#else
  ASSERT(write_req.new_path == NULL);
  ASSERT(write_req.bufs == NULL);
#endif
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(NULL, &read_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(NULL, &write_req, 0, &iov, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&write_req);

  /* If the arguments are invalid, the loop should not be kept open */
  loop = uv_default_loop();

  r = uv_fs_read(loop, &read_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_write(loop, &write_req, 0, NULL, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_read(loop, &read_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(NULL, 0);
  r = uv_fs_write(loop, &write_req, 0, &iov, 0, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);
  uv_fs_req_cleanup(&write_req);

  return 0;
}